

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpexternaltransmitter.cpp
# Opt level: O0

void __thiscall jrtplib::RTPExternalTransmitter::Destroy(RTPExternalTransmitter *this)

{
  uint8_t *buf;
  RTPMemoryManager *mgr;
  RTPExternalTransmitter *this_local;
  
  if (((this->init & 1U) != 0) && ((this->created & 1U) != 0)) {
    if (this->localhostname != (uint8_t *)0x0) {
      buf = this->localhostname;
      mgr = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
      RTPDeleteByteArray(buf,mgr);
      this->localhostname = (uint8_t *)0x0;
      this->localhostnamelength = 0;
    }
    FlushPackets(this);
    this->created = false;
    if ((this->waitingfordata & 1U) == 0) {
      RTPAbortDescriptors::Destroy(&this->m_abortDesc);
    }
    else {
      RTPAbortDescriptors::SendAbortSignal(&this->m_abortDesc);
      RTPAbortDescriptors::Destroy(&this->m_abortDesc);
    }
  }
  return;
}

Assistant:

void RTPExternalTransmitter::Destroy()
{
	if (!init)
		return;

	MAINMUTEX_LOCK
	if (!created)
	{
		MAINMUTEX_UNLOCK;
		return;
	}

	if (localhostname)
	{
		RTPDeleteByteArray(localhostname,GetMemoryManager());
		localhostname = 0;
		localhostnamelength = 0;
	}
	
	FlushPackets();
	created = false;
	
	if (waitingfordata)
	{
		m_abortDesc.SendAbortSignal();
		m_abortDesc.Destroy();
		MAINMUTEX_UNLOCK
		WAITMUTEX_LOCK // to make sure that the WaitForIncomingData function ended
		WAITMUTEX_UNLOCK
	}
	else
		m_abortDesc.Destroy();

	MAINMUTEX_UNLOCK
}